

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

string * __thiscall
deqp::egl::MakeCurrentPerfCase::Spec::toName_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream local_190 [8];
  ostringstream name;
  Spec *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"context");
  if (1 < this->contextCount) {
    poVar1 = std::operator<<((ostream *)local_190,"s_");
    std::ostream::operator<<(poVar1,this->contextCount);
  }
  if ((this->surfaceTypes & SURFACETYPE_WINDOW) != 0) {
    poVar1 = std::operator<<((ostream *)local_190,"_window");
    pcVar2 = "";
    if (1 < this->surfaceCount) {
      pcVar2 = "s";
    }
    std::operator<<(poVar1,pcVar2);
  }
  if ((this->surfaceTypes & SURFACETYPE_PIXMAP) != 0) {
    poVar1 = std::operator<<((ostream *)local_190,"_pixmap");
    pcVar2 = "";
    if (1 < this->surfaceCount) {
      pcVar2 = "s";
    }
    std::operator<<(poVar1,pcVar2);
  }
  if ((this->surfaceTypes & SURFACETYPE_PBUFFER) != 0) {
    poVar1 = std::operator<<((ostream *)local_190,"_pbuffer");
    pcVar2 = "";
    if (1 < this->surfaceCount) {
      pcVar2 = "s";
    }
    std::operator<<(poVar1,pcVar2);
  }
  if (1 < this->surfaceCount) {
    poVar1 = std::operator<<((ostream *)local_190,"_");
    std::ostream::operator<<(poVar1,this->surfaceCount);
  }
  if ((this->release & 1U) != 0) {
    std::operator<<((ostream *)local_190,"_release");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string MakeCurrentPerfCase::Spec::toName (void) const
{
	ostringstream name;

	name << "context";

	if (contextCount > 1)
		name << "s_" << contextCount;

	if ((surfaceTypes & SURFACETYPE_WINDOW) != 0)
		name << "_window" << (surfaceCount > 1 ? "s" : "");

	if ((surfaceTypes & SURFACETYPE_PIXMAP) != 0)
		name << "_pixmap" << (surfaceCount > 1 ? "s" : "");

	if ((surfaceTypes & SURFACETYPE_PBUFFER) != 0)
		name << "_pbuffer" << (surfaceCount > 1 ? "s" : "");

	if (surfaceCount > 1)
		name << "_" << surfaceCount;

	if (release)
		name << "_release";

	return name.str();
}